

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyTests.cpp
# Opt level: O2

void __thiscall IsNotEmptyTests::IsNotEmptyTests(IsNotEmptyTests *this)

{
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_0027e158;
  return;
}

Assistant:

virtual void Run()
	{
		Then("an empty string is empty", []() {
			AssertThat(ut11::Is::Not::Empty(""), ut11::Is::False);
			AssertThat(ut11::Is::Not::Empty(std::string("")), ut11::Is::False);
		});
		Then("an empty vector is empty", []() {
			AssertThat(ut11::Is::Not::Empty(std::vector<int>()), ut11::Is::False);
		});

		Then("a string with content is not empty", []() {
			AssertThat(ut11::Is::Not::Empty("String With Content"), ut11::Is::True);
			AssertThat(ut11::Is::Not::Empty(std::string("String With Content")), ut11::Is::True);
		});
		Then("a vector with content is not empty", []() {
			AssertThat(ut11::Is::Not::Empty(std::vector<int>({1,2,3})), ut11::Is::True);
		});

		Then("Is::Empty is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Empty) >::value, ut11::Is::True);
		});

		Then("Is::Empty has an error message", []() {
			AssertThat(ut11::Is::Not::Empty.GetErrorMessage(""), ut11::Is::Not::EqualTo(""));
		});
	}